

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall
amrex::MLMG::getEBFluxes
          (MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_eb_flux)

{
  pointer pAVar1;
  bool bVar2;
  Any *s;
  pointer this_00;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> solmf;
  MultiFab *local_50;
  _Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_48;
  
  bVar2 = MLLinOp::isCellCentered(this->linop);
  if (!bVar2) {
    Abort_host("getEBFluxes is for cell-centered only");
  }
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pAVar1 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pAVar1; this_00 = this_00 + 1) {
    local_50 = Any::get<amrex::MultiFab>(this_00);
    std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::emplace_back<amrex::MultiFab*>
              ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&local_48,&local_50);
  }
  getEBFluxes(this,a_eb_flux,
              (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_48);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base(&local_48)
  ;
  return;
}

Assistant:

void
MLMG::getEBFluxes (const Vector<MultiFab*>& a_eb_flux)
{
    if (!linop.isCellCentered()) {
       amrex::Abort("getEBFluxes is for cell-centered only");
    }

    AMREX_ASSERT(sol.size() == a_eb_flux.size());
    Vector<MultiFab*> solmf;
    for (auto & s : sol) {
        solmf.push_back(&(s.get<MultiFab>()));
    }
    getEBFluxes(a_eb_flux, solmf);
}